

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

char * fetchUserReservations(int thread_index,User *user)

{
  char local_428 [8];
  char sql_command [1024];
  query_t *query;
  User *user_local;
  char *pcStack_10;
  int thread_index_local;
  
  sql_command._1016_8_ = malloc(0x10);
  memset(local_428,0,0x400);
  strcat(local_428,"SELECT date, room, code FROM Bookings WHERE user = \'");
  strcat(local_428,user->username);
  strcat(local_428,"\' ORDER BY date_yyyymmdd, room");
  sql_command._1016_8_ = queryDatabase(thread_index,0,local_428);
  if (((query_t *)sql_command._1016_8_)->rv == 0) {
    pcStack_10 = (char *)((query_t *)sql_command._1016_8_)->query_result;
  }
  else {
    printf("%s\n","Error querying the database!");
    free((void *)sql_command._1016_8_);
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

char* 
fetchUserReservations(int thread_index, User* user)
{
    query_t* query = (query_t*) malloc(sizeof(query_t));
 
    char sql_command[1024];
    memset(sql_command, '\0', sizeof(sql_command));

    strcat(sql_command, "SELECT date, room, code FROM Bookings WHERE user = '");
    strcat(sql_command, user->username);
    #if SORT_VIEW_BY_DATE
        strcat(sql_command, "' ORDER BY date_yyyymmdd, room");
    #else
        strcat(sql_command, "' ORDER BY id");
    #endif
    

    query = queryDatabase(thread_index, 0, sql_command);


    if (query->rv == 0){
        // free(query); // cant free here because it has to be returned... ¯\_(ツ)_/¯
        return (char*) query->query_result;
    }
    else {
        printf("%s\n", "Error querying the database!");

        free(query);
        return "";
    }

}